

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O1

NativeEntryPointData * __thiscall
Js::EntryPointInfo::EnsureNativeEntryPointData(EntryPointInfo *this)

{
  ScriptContext *pSVar1;
  Recycler *alloc;
  InProcNativeEntryPointData *this_00;
  undefined1 local_48 [8];
  TrackAllocData data;
  
  this_00 = (InProcNativeEntryPointData *)(this->nativeEntryPointData).ptr;
  if (this_00 == (InProcNativeEntryPointData *)0x0) {
    pSVar1 = GetScriptContext(this);
    local_48 = (undefined1  [8])&InProcNativeEntryPointData::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_2ab601b;
    data.filename._0_4_ = 0x2044;
    alloc = Memory::Recycler::TrackAllocInfo(pSVar1->recycler,(TrackAllocData *)local_48);
    this_00 = (InProcNativeEntryPointData *)new<Memory::Recycler>(0xe0,alloc,0x38bbb2);
    InProcNativeEntryPointData::InProcNativeEntryPointData(this_00);
    Memory::Recycler::WBSetBit((char *)&this->nativeEntryPointData);
    (this->nativeEntryPointData).ptr = (NativeEntryPointData *)this_00;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->nativeEntryPointData);
  }
  return &this_00->super_NativeEntryPointData;
}

Assistant:

NativeEntryPointData * EntryPointInfo::EnsureNativeEntryPointData()
    {
        NativeEntryPointData * data = this->nativeEntryPointData;
        if (data == nullptr)
        {
#if ENABLE_OOP_NATIVE_CODEGEN
            if (JITManager::GetJITManager()->IsOOPJITEnabled())
            {
                data = RecyclerNew(this->GetScriptContext()->GetRecycler(), OOPNativeEntryPointData);
            }
            else
#endif
            {
                data = RecyclerNew(this->GetScriptContext()->GetRecycler(), InProcNativeEntryPointData);
            }
            this->nativeEntryPointData = data;
        }
        return data;
    }